

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O3

int eval_boolean(eval_info *info,coda_expression *expr,int *value)

{
  coda_cursor *pcVar1;
  coda_expression_type cVar2;
  int64_t iVar3;
  int iVar4;
  coda_expression_node_type cVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  pcre2_code_8 *code;
  pcre2_match_data_8 *match_data;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *message;
  coda_expression *pcVar12;
  size_t sVar13;
  PCRE2_SPTR8 pattern_00;
  int64_t *value_00;
  long lVar14;
  bool bVar15;
  bool bVar16;
  double b;
  char *a_2;
  char *b_2;
  long len_b;
  long len_a;
  int errorcode;
  char *pattern;
  long pattern_length;
  double a;
  undefined8 local_388;
  char *local_380;
  char *local_378;
  size_t local_370;
  coda_special_type local_368;
  undefined4 uStack_364;
  int local_35c;
  char *local_358;
  size_t local_350;
  undefined8 local_348;
  
  cVar5 = expr->tag;
  if ((int)cVar5 < 0x28) {
    if ((int)cVar5 < 0x12) {
      if (cVar5 != expr_array_all) {
        if (cVar5 != expr_array_exists) {
          if (cVar5 != expr_at) goto switchD_001392f0_caseD_2b;
          if (info->orig_cursor == (coda_cursor *)0x0) {
            __assert_fail("info->orig_cursor != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                          ,0x57a,"int eval_boolean(eval_info *, const coda_expression *, int *)");
          }
          memcpy(&local_348,&info->cursor,0x310);
          iVar4 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
          if (iVar4 != 0) {
            return -1;
          }
          goto LAB_0013a08d;
        }
        if (info->orig_cursor == (coda_cursor *)0x0) {
          __assert_fail("info->orig_cursor != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x50d,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        pcVar1 = &info->cursor;
        memcpy(&local_348,pcVar1,0x310);
        iVar4 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = coda_cursor_get_num_elements(pcVar1,&local_388);
        if (iVar4 != 0) {
          return -1;
        }
        if (0 < CONCAT44(local_388._4_4_,(coda_type_class)local_388)) {
          iVar4 = coda_cursor_goto_first_array_element(pcVar1);
          if (iVar4 != 0) {
            return -1;
          }
          if (0 < CONCAT44(local_388._4_4_,(coda_type_class)local_388)) {
            lVar14 = 0;
            do {
              iVar4 = eval_boolean(info,*(coda_expression **)(expr + 2),(int *)&local_368);
              if (iVar4 != 0) {
                return -1;
              }
              if (local_368 != coda_special_no_data) {
                *value = 1;
                return 0;
              }
              lVar8 = CONCAT44(local_388._4_4_,(coda_type_class)local_388);
              if (lVar14 < lVar8 + -1) {
                iVar4 = coda_cursor_goto_next_array_element(pcVar1);
                if (iVar4 != 0) {
                  return -1;
                }
                lVar8 = CONCAT44(local_388._4_4_,(coda_type_class)local_388);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < lVar8);
          }
        }
LAB_0013a087:
        *value = 0;
        goto LAB_0013a08d;
      }
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x4dc,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      pcVar1 = &info->cursor;
      memcpy(&local_348,pcVar1,0x310);
      iVar4 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = coda_cursor_get_num_elements(pcVar1,&local_388);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < CONCAT44(local_388._4_4_,(coda_type_class)local_388)) {
        iVar4 = coda_cursor_goto_first_array_element(pcVar1);
        if (iVar4 != 0) {
          return -1;
        }
        if (0 < CONCAT44(local_388._4_4_,(coda_type_class)local_388)) {
          lVar14 = 0;
          do {
            iVar4 = eval_boolean(info,*(coda_expression **)(expr + 2),(int *)&local_368);
            if (iVar4 != 0) {
              return -1;
            }
            if (local_368 == coda_special_no_data) {
              *value = 0;
              return 0;
            }
            lVar8 = CONCAT44(local_388._4_4_,(coda_type_class)local_388);
            if (lVar14 < lVar8 + -1) {
              iVar4 = coda_cursor_goto_next_array_element(pcVar1);
              if (iVar4 != 0) {
                return -1;
              }
              lVar8 = CONCAT44(local_388._4_4_,(coda_type_class)local_388);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < lVar8);
        }
      }
    }
    else {
      if (cVar5 == expr_constant_boolean) {
        cVar5 = expr[1].tag;
        goto LAB_001399e4;
      }
      if (cVar5 == expr_equal) {
        pcVar12 = *(coda_expression **)&expr[1].is_constant;
        cVar2 = pcVar12->result_type;
        if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
          iVar4 = eval_float(info,pcVar12,(double *)&local_348);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
          if (iVar4 != 0) {
            return -1;
          }
          bVar16 = (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388) ==
                   (double)CONCAT44(local_348._4_4_,(int)local_348);
          goto LAB_001398ff;
        }
        if (cVar2 != coda_expression_string) {
          if (cVar2 != coda_expression_integer) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                          ,0x2c5,"int eval_boolean(eval_info *, const coda_expression *, int *)");
          }
          iVar4 = eval_integer(info,pcVar12,&local_348);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
          if (iVar4 != 0) {
            return -1;
          }
          uVar6 = (uint)(CONCAT44(local_348._4_4_,(int)local_348) ==
                        CONCAT44(local_388._4_4_,(coda_type_class)local_388));
          goto LAB_00139cd3;
        }
        iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                            &local_378);
        if (iVar4 != 0) goto LAB_0013a069;
        sVar9 = CONCAT44(uStack_364,local_368);
        sVar13 = local_370;
        if ((long)sVar9 < (long)local_370) {
          sVar13 = sVar9;
        }
        if ((long)sVar13 < 1) {
          sVar11 = 0;
        }
        else {
          sVar10 = 0;
          do {
            sVar11 = sVar10;
            if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
                local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
            sVar10 = sVar10 + 1;
            sVar11 = sVar13;
          } while (sVar13 != sVar10);
        }
        bVar16 = sVar9 == local_370 && sVar11 == sVar9;
        goto LAB_0013a3a7;
      }
      if (cVar5 != expr_exists) goto switchD_001392f0_caseD_2b;
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x4b2,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      pcVar1 = &info->cursor;
      memcpy(&local_348,pcVar1,0x310);
      iVar4 = eval_cursor(info,*(coda_expression **)&expr[1].is_constant);
      if (iVar4 != 0) {
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        if (*piVar7 != -0x191) {
          *piVar7 = 0;
          *value = 0;
          memcpy(pcVar1,&local_348,0x310);
          return 0;
        }
        return -1;
      }
      iVar4 = coda_cursor_get_type_class(pcVar1,(coda_type_class *)&local_388);
      if (iVar4 != 0) {
        return -1;
      }
      if ((coda_type_class)local_388 == coda_special_class) {
        iVar4 = coda_cursor_get_special_type(pcVar1,&local_368);
        if (iVar4 != 0) {
          return -1;
        }
        if (local_368 == coda_special_no_data) goto LAB_0013a087;
      }
    }
    *value = 1;
LAB_0013a08d:
    memcpy(&info->cursor,&local_348,0x310);
    return 0;
  }
  switch(cVar5) {
  case expr_greater_equal:
    pcVar12 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar12->result_type;
    if ((cVar2 != coda_expression_float) && (*(int *)(*(long *)(expr + 2) + 4) != 2)) {
      if (cVar2 != coda_expression_string) {
        if (cVar2 != coda_expression_integer) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x37f,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        iVar4 = eval_integer(info,pcVar12,&local_348);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
        if (iVar4 != 0) {
          return -1;
        }
        uVar6 = (uint)(CONCAT44(local_388._4_4_,(coda_type_class)local_388) <=
                      CONCAT44(local_348._4_4_,(int)local_348));
LAB_00139cd3:
        *value = uVar6;
        return 0;
      }
      iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                          &local_378);
      if (iVar4 != 0) goto LAB_0013a069;
      sVar9 = CONCAT44(uStack_364,local_368);
      sVar13 = local_370;
      if ((long)sVar9 < (long)local_370) {
        sVar13 = sVar9;
      }
      if ((long)sVar13 < 1) {
        sVar11 = 0;
      }
      else {
        sVar10 = 0;
        do {
          sVar11 = sVar10;
          if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
              local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
          sVar10 = sVar10 + 1;
          sVar11 = sVar13;
        } while (sVar13 != sVar10);
      }
      if (sVar11 == sVar9) {
        bVar16 = sVar9 == local_370;
      }
      else {
        bVar16 = true;
        if (sVar11 != local_370) {
          bVar16 = (byte)local_378[CONCAT44(local_388._4_4_,(coda_type_class)local_388) + sVar11] <
                   (byte)local_380[CONCAT44(local_348._4_4_,(int)local_348) + sVar11];
        }
      }
      *value = (uint)bVar16;
      goto LAB_0013a3aa;
    }
    iVar4 = eval_float(info,pcVar12,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
    if (iVar4 != 0) {
      return -1;
    }
    bVar16 = (double)CONCAT44(local_348._4_4_,(int)local_348) <
             (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388);
    goto LAB_00139640;
  case expr_greater:
    pcVar12 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar12->result_type;
    if ((cVar2 != coda_expression_float) && (*(int *)(*(long *)(expr + 2) + 4) != 2)) {
      if (cVar2 != coda_expression_string) {
        if (cVar2 != coda_expression_integer) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x341,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        iVar4 = eval_integer(info,pcVar12,&local_348);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
        if (iVar4 != 0) {
          return -1;
        }
        uVar6 = (uint)(CONCAT44(local_388._4_4_,(coda_type_class)local_388) <
                      CONCAT44(local_348._4_4_,(int)local_348));
        goto LAB_00139cd3;
      }
      iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                          &local_378);
      if (iVar4 == 0) {
        sVar9 = CONCAT44(uStack_364,local_368);
        sVar13 = local_370;
        if ((long)sVar9 < (long)local_370) {
          sVar13 = sVar9;
        }
        uVar6 = 0;
        if ((long)sVar13 < 1) {
          sVar11 = 0;
        }
        else {
          sVar10 = 0;
          do {
            sVar11 = sVar10;
            if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
                local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
            sVar10 = sVar10 + 1;
            sVar11 = sVar13;
          } while (sVar13 != sVar10);
        }
        if ((sVar11 != sVar9) && (uVar6 = 1, sVar11 != local_370)) {
          uVar6 = (uint)((byte)local_378[CONCAT44(local_388._4_4_,(coda_type_class)local_388) +
                                         sVar11] <
                        (byte)local_380[CONCAT44(local_348._4_4_,(int)local_348) + sVar11]);
        }
        *value = uVar6;
        goto LAB_0013a3aa;
      }
      goto LAB_0013a069;
    }
    iVar4 = eval_float(info,pcVar12,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
    if (iVar4 != 0) {
      return -1;
    }
    bVar16 = (double)CONCAT44(local_348._4_4_,(int)local_348) ==
             (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388);
    bVar15 = (double)CONCAT44(local_348._4_4_,(int)local_348) <
             (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388);
    goto LAB_001396f4;
  case expr_if:
    iVar4 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,(int *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    if ((int)local_348 == 0) {
      pcVar12 = *(coda_expression **)&expr[2].is_constant;
    }
    else {
      pcVar12 = *(coda_expression **)(expr + 2);
    }
    iVar4 = eval_boolean(info,pcVar12,value);
    if (iVar4 != 0) {
      return -1;
    }
    return 0;
  case expr_index:
  case expr_index_var:
  case expr_integer:
  case expr_length:
  case expr_ltrim:
  case expr_max:
  case expr_min:
  case expr_modulo:
  case expr_multiply:
  case expr_neg:
  case expr_num_dims:
  case expr_num_elements:
  case expr_or:
  case expr_power:
  case expr_product_class:
  case expr_product_format:
  case expr_product_type:
  case expr_product_version:
    goto switchD_001392f0_caseD_2b;
  case expr_isinf:
    iVar4 = eval_float(info,*(coda_expression **)&expr[1].is_constant,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    cVar5 = coda_isInf((double)CONCAT44(local_348._4_4_,(int)local_348));
    break;
  case expr_ismininf:
    iVar4 = eval_float(info,*(coda_expression **)&expr[1].is_constant,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    cVar5 = coda_isMinInf((double)CONCAT44(local_348._4_4_,(int)local_348));
    break;
  case expr_isnan:
    iVar4 = eval_float(info,*(coda_expression **)&expr[1].is_constant,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    cVar5 = coda_isNaN((double)CONCAT44(local_348._4_4_,(int)local_348));
    break;
  case expr_isplusinf:
    iVar4 = eval_float(info,*(coda_expression **)&expr[1].is_constant,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    cVar5 = coda_isPlusInf((double)CONCAT44(local_348._4_4_,(int)local_348));
    break;
  case expr_less_equal:
    pcVar12 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar12->result_type;
    if ((cVar2 != coda_expression_float) && (*(int *)(*(long *)(expr + 2) + 4) != 2)) {
      if (cVar2 != coda_expression_string) {
        if (cVar2 != coda_expression_integer) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x3fb,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        iVar4 = eval_integer(info,pcVar12,&local_348);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
        if (iVar4 != 0) {
          return -1;
        }
        uVar6 = (uint)(CONCAT44(local_348._4_4_,(int)local_348) <=
                      CONCAT44(local_388._4_4_,(coda_type_class)local_388));
        goto LAB_00139cd3;
      }
      iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                          &local_378);
      if (iVar4 != 0) goto LAB_0013a069;
      sVar9 = CONCAT44(uStack_364,local_368);
      sVar13 = local_370;
      if ((long)sVar9 < (long)local_370) {
        sVar13 = sVar9;
      }
      if ((long)sVar13 < 1) {
        sVar11 = 0;
      }
      else {
        sVar10 = 0;
        do {
          sVar11 = sVar10;
          if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
              local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
          sVar10 = sVar10 + 1;
          sVar11 = sVar13;
        } while (sVar13 != sVar10);
      }
      uVar6 = 1;
      if ((sVar11 != sVar9) && (uVar6 = 0, sVar11 != local_370)) {
        uVar6 = (uint)((byte)local_380[CONCAT44(local_348._4_4_,(int)local_348) + sVar11] <=
                      (byte)local_378[CONCAT44(local_388._4_4_,(coda_type_class)local_388) + sVar11]
                      );
      }
LAB_0013a376:
      *value = uVar6;
LAB_0013a3aa:
      if (0 < (long)sVar9) {
        free(local_380);
      }
      if ((long)local_370 < 1) {
        return 0;
      }
      free(local_378);
      return 0;
    }
    iVar4 = eval_float(info,pcVar12,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
    if (iVar4 != 0) {
      return -1;
    }
    bVar16 = (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388) <
             (double)CONCAT44(local_348._4_4_,(int)local_348);
LAB_00139640:
    cVar5 = (coda_expression_node_type)!bVar16;
    break;
  case expr_less:
    pcVar12 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar12->result_type;
    if ((cVar2 != coda_expression_float) && (*(int *)(*(long *)(expr + 2) + 4) != 2)) {
      if (cVar2 != coda_expression_string) {
        if (cVar2 != coda_expression_integer) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                        ,0x3bd,"int eval_boolean(eval_info *, const coda_expression *, int *)");
        }
        iVar4 = eval_integer(info,pcVar12,&local_348);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
        if (iVar4 != 0) {
          return -1;
        }
        uVar6 = (uint)(CONCAT44(local_348._4_4_,(int)local_348) <
                      CONCAT44(local_388._4_4_,(coda_type_class)local_388));
        goto LAB_00139cd3;
      }
      iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                          &local_378);
      if (iVar4 != 0) goto LAB_0013a069;
      sVar9 = CONCAT44(uStack_364,local_368);
      sVar13 = local_370;
      if ((long)sVar9 < (long)local_370) {
        sVar13 = sVar9;
      }
      if ((long)sVar13 < 1) {
        sVar11 = 0;
      }
      else {
        sVar10 = 0;
        do {
          sVar11 = sVar10;
          if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
              local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
          sVar10 = sVar10 + 1;
          sVar11 = sVar13;
        } while (sVar13 != sVar10);
      }
      if (sVar11 == sVar9) {
        uVar6 = -(uint)(sVar9 != local_370);
      }
      else {
        uVar6 = 0;
        if (sVar11 != local_370) {
          uVar6 = ((byte)local_378[CONCAT44(local_388._4_4_,(coda_type_class)local_388) + sVar11] <
                  (byte)local_380[CONCAT44(local_348._4_4_,(int)local_348) + sVar11]) - 1;
        }
      }
      uVar6 = uVar6 >> 0x1f;
      goto LAB_0013a376;
    }
    iVar4 = eval_float(info,pcVar12,(double *)&local_348);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
    if (iVar4 != 0) {
      return -1;
    }
    bVar16 = (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388) ==
             (double)CONCAT44(local_348._4_4_,(int)local_348);
    bVar15 = (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388) <
             (double)CONCAT44(local_348._4_4_,(int)local_348);
LAB_001396f4:
    cVar5 = (coda_expression_node_type)(!bVar15 && !bVar16);
    break;
  case expr_logical_and:
    iVar4 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar4 != 0) {
      return -1;
    }
    if (*value == 0) {
      return 0;
    }
    goto LAB_001394f8;
  case expr_logical_or:
    iVar4 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar4 != 0) {
      return -1;
    }
    if (*value != 0) {
      return 0;
    }
LAB_001394f8:
    iVar4 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
    if (iVar4 == 0) {
      return 0;
    }
    return -1;
  case expr_not_equal:
    pcVar12 = *(coda_expression **)&expr[1].is_constant;
    cVar2 = pcVar12->result_type;
    if ((cVar2 == coda_expression_float) || (*(int *)(*(long *)(expr + 2) + 4) == 2)) {
      iVar4 = eval_float(info,pcVar12,(double *)&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_float(info,*(coda_expression **)(expr + 2),(double *)&local_388);
      if (iVar4 != 0) {
        return -1;
      }
      bVar16 = (double)CONCAT44(local_388._4_4_,(coda_type_class)local_388) !=
               (double)CONCAT44(local_348._4_4_,(int)local_348);
LAB_001398ff:
      *value = -(uint)bVar16 & 1;
      return 0;
    }
    if (cVar2 != coda_expression_string) {
      if (cVar2 != coda_expression_integer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x303,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      iVar4 = eval_integer(info,pcVar12,&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_integer(info,*(coda_expression **)(expr + 2),&local_388);
      if (iVar4 != 0) {
        return -1;
      }
      uVar6 = (uint)(CONCAT44(local_348._4_4_,(int)local_348) !=
                    CONCAT44(local_388._4_4_,(coda_type_class)local_388));
      goto LAB_00139cd3;
    }
    iVar4 = eval_string(info,pcVar12,&local_348,(long *)&local_368,&local_380);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_string(info,*(coda_expression **)(expr + 2),&local_388,(long *)&local_370,
                        &local_378);
    if (iVar4 != 0) goto LAB_0013a069;
    sVar9 = CONCAT44(uStack_364,local_368);
    sVar13 = local_370;
    if ((long)sVar9 < (long)local_370) {
      sVar13 = sVar9;
    }
    if ((long)sVar13 < 1) {
      sVar11 = 0;
    }
    else {
      sVar10 = 0;
      do {
        sVar11 = sVar10;
        if (local_380[sVar10 + CONCAT44(local_348._4_4_,(int)local_348)] !=
            local_378[sVar10 + CONCAT44(local_388._4_4_,(coda_type_class)local_388)]) break;
        sVar10 = sVar10 + 1;
        sVar11 = sVar13;
      } while (sVar13 != sVar10);
    }
    bVar16 = sVar9 != local_370 || sVar11 != sVar9;
LAB_0013a3a7:
    *value = (uint)bVar16;
    goto LAB_0013a3aa;
  case expr_not:
    iVar4 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,value);
    if (iVar4 != 0) {
      return -1;
    }
    cVar5 = (coda_expression_node_type)(*value == 0);
    break;
  case expr_regex:
    iVar4 = eval_string(info,*(coda_expression **)&expr[1].is_constant,(long *)&local_378,
                        (long *)&local_350,&local_358);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = eval_string(info,*(coda_expression **)(expr + 2),(long *)&local_368,(long *)&local_370,
                        &local_380);
    if (iVar4 == 0) {
      if ((long)local_350 < 1) {
        pattern_00 = "";
        local_350 = 0;
      }
      else {
        pattern_00 = (PCRE2_SPTR8)(local_358 + (long)local_378);
      }
      code = coda_pcre2_compile_8
                       (pattern_00,local_350,0x30,&local_35c,&local_388,
                        (pcre2_compile_context_8 *)0x0);
      if (local_358 != (char *)0x0) {
        free(local_358);
      }
      if (code != (pcre2_code_8 *)0x0) {
        if ((local_380 == (char *)0x0) && (local_380 = strdup((char *)""), local_380 == (char *)0x0)
           ) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                         ,0x48c);
        }
        else {
          match_data = coda_pcre2_match_data_create_from_pattern_8
                                 (code,(pcre2_general_context_8 *)0x0);
          if (match_data != (pcre2_match_data_8 *)0x0) {
            uVar6 = coda_pcre2_match_8(code,(PCRE2_SPTR8)
                                            (local_380 + CONCAT44(uStack_364,local_368)),local_370,0
                                       ,0,match_data,(pcre2_match_context_8 *)0x0);
            free(local_380);
            coda_pcre2_code_free_8(code);
            coda_pcre2_match_data_free_8(match_data);
            if ((int)uVar6 < -1) {
              coda_set_error(-0x191,"could not evaluate regex pattern (error code %d)",(ulong)uVar6)
              ;
              return -1;
            }
            if (uVar6 == 0) {
              message = "regex pattern contains too many subexpressions";
              goto LAB_00139a0a;
            }
            cVar5 = (coda_expression_node_type)(0 < (int)uVar6);
            break;
          }
          coda_set_error(-1,"could not allocate regexp match data (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                         ,0x496);
          free(local_380);
        }
        coda_pcre2_code_free_8(code);
        return -1;
      }
      coda_pcre2_get_error_message_8(local_35c,(PCRE2_UCHAR8 *)&local_348,0x100);
      coda_set_error(-0x191,"invalid format for regex pattern (\'%s\' at position %d)",&local_348,
                     CONCAT44(local_388._4_4_,(coda_type_class)local_388));
      local_358 = local_380;
    }
    local_380 = local_358;
    if (local_358 == (char *)0x0) {
      return -1;
    }
LAB_0013a069:
    free(local_380);
    return -1;
  default:
    if (cVar5 == expr_variable_exists) {
      if (info->orig_cursor == (coda_cursor *)0x0) {
        __assert_fail("info->orig_cursor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                      ,0x53e,"int eval_boolean(eval_info *, const coda_expression *, int *)");
      }
      if (info->variable_name == (char *)0x0) {
        iVar4 = coda_product_variable_get_size
                          (info->orig_cursor->product,*(char **)(expr + 1),&local_348);
        if (iVar4 != 0) {
          return -1;
        }
        info->variable_name = *(char **)(expr + 1);
        if (0 < CONCAT44(local_348._4_4_,(int)local_348)) {
          lVar14 = 0;
          do {
            info->variable_index = lVar14;
            iVar4 = eval_boolean(info,*(coda_expression **)&expr[1].is_constant,(int *)&local_388);
            if (iVar4 != 0) {
              return -1;
            }
            if ((coda_type_class)local_388 != coda_record_class) {
              *value = 1;
              goto LAB_0013a1be;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < CONCAT44(local_348._4_4_,(int)local_348));
        }
        *value = 0;
LAB_0013a1be:
        info->variable_name = (char *)0x0;
        return 0;
      }
      message = "cannot perform search within search for product variables";
LAB_00139a0a:
      coda_set_error(-0x191,message);
      return -1;
    }
    if (cVar5 == expr_with) {
      value_00 = (int64_t *)((long)((info->cursor).stack + -3) + (long)**(char **)(expr + 1) * 8);
      iVar3 = *value_00;
      iVar4 = eval_integer(info,*(coda_expression **)&expr[1].is_constant,value_00);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = eval_boolean(info,*(coda_expression **)(expr + 2),value);
      if (iVar4 == 0) {
        *value_00 = iVar3;
        return 0;
      }
      return -1;
    }
    goto switchD_001392f0_caseD_2b;
  }
LAB_001399e4:
  *value = cVar5;
  return 0;
switchD_001392f0_caseD_2b:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                ,0x599,"int eval_boolean(eval_info *, const coda_expression *, int *)");
}

Assistant:

static int eval_boolean(eval_info *info, const coda_expression *expr, int *value)
{
    const coda_expression_operation *opexpr;

    if (expr->tag == expr_constant_boolean)
    {
        *value = ((coda_expression_bool_constant *)expr)->value;
        return 0;
    }

    opexpr = (const coda_expression_operation *)expr;
    switch (opexpr->tag)
    {
        case expr_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a == b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) == 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a != b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) != 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a > b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) > 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_greater_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a >= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) >= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a < b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) < 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_less_equal:
            if (opexpr->operand[0]->result_type == coda_expression_float ||
                opexpr->operand[1]->result_type == coda_expression_float)
            {
                double a, b;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_float(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_integer)
            {
                int64_t a, b;

                if (eval_integer(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                if (eval_integer(info, opexpr->operand[1], &b) != 0)
                {
                    return -1;
                }
                *value = (a <= b);
            }
            else if (opexpr->operand[0]->result_type == coda_expression_string)
            {
                long off_a, off_b;
                long len_a, len_b;
                char *a;
                char *b;

                if (eval_string(info, opexpr->operand[0], &off_a, &len_a, &a) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &off_b, &len_b, &b) != 0)
                {
                    free(a);
                    return -1;
                }
                *value = (compare_strings(off_a, len_a, a, off_b, len_b, b) <= 0);
                if (len_a > 0)
                {
                    free(a);
                }
                if (len_b > 0)
                {
                    free(b);
                }
            }
            else
            {
                assert(0);
                exit(1);
            }
            break;
        case expr_not:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            *value = !(*value);
            break;
        case expr_logical_and:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value == 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_logical_or:
            if (eval_boolean(info, opexpr->operand[0], value) != 0)
            {
                return -1;
            }
            if (*value != 0)
            {
                return 0;
            }
            if (eval_boolean(info, opexpr->operand[1], value) != 0)
            {
                return -1;
            }
            break;
        case expr_isnan:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isNaN(a);
            }
            break;
        case expr_isinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isInf(a);
            }
            break;
        case expr_isplusinf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isPlusInf(a);
            }
            break;
        case expr_ismininf:
            {
                double a;

                if (eval_float(info, opexpr->operand[0], &a) != 0)
                {
                    return -1;
                }
                *value = coda_isMinInf(a);
            }
            break;
        case expr_regex:
            {
                int errorcode;
                PCRE2_SIZE erroffset;
                long matchstring_offset;
                long matchstring_length;
                char *matchstring;
                long pattern_offset;
                long pattern_length;
                char *pattern;
                pcre2_match_data *match_data;
                pcre2_code *re;
                int rc;

                if (eval_string(info, opexpr->operand[0], &pattern_offset, &pattern_length, &pattern) != 0)
                {
                    return -1;
                }
                if (eval_string(info, opexpr->operand[1], &matchstring_offset, &matchstring_length, &matchstring) != 0)
                {
                    if (pattern != NULL)
                    {
                        free(pattern);
                    }
                    return -1;
                }

                if (pattern_length > 0)
                {
                    re = pcre2_compile((PCRE2_SPTR8)&pattern[pattern_offset], pattern_length,
                                       PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset, NULL);
                }
                else
                {
                    re = pcre2_compile((PCRE2_SPTR8)"", 0, PCRE2_DOTALL | PCRE2_DOLLAR_ENDONLY, &errorcode, &erroffset,
                                       NULL);
                }
                if (pattern != NULL)
                {
                    free(pattern);
                }
                if (re == NULL)
                {
                    PCRE2_UCHAR buffer[256];

                    pcre2_get_error_message(errorcode, buffer, sizeof(buffer));
                    coda_set_error(CODA_ERROR_EXPRESSION,
                                   "invalid format for regex pattern ('%s' at position %d)", buffer, erroffset);
                    if (matchstring != NULL)
                    {
                        free(matchstring);
                    }
                    return -1;
                }

                if (matchstring == NULL)
                {
                    /* pcre2_match does not except NULL for an empty matchstring */
                    matchstring = strdup("");
                    if (matchstring == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)",
                                       __FILE__, __LINE__);
                        pcre2_code_free(re);
                        return -1;
                    }
                }

                match_data = pcre2_match_data_create_from_pattern(re, NULL);
                if (match_data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "could not allocate regexp match data (%s:%u)",
                                   __FILE__, __LINE__);
                    free(matchstring);
                    pcre2_code_free(re);
                    return -1;
                }
                rc = pcre2_match(re, (PCRE2_SPTR8)&matchstring[matchstring_offset], matchstring_length, 0, 0,
                                 match_data, NULL);
                free(matchstring);
                pcre2_code_free(re);
                pcre2_match_data_free(match_data);
                if (rc < 0 && rc != PCRE2_ERROR_NOMATCH)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "could not evaluate regex pattern (error code %d)", rc);
                    return -1;
                }
                if (rc == 0)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "regex pattern contains too many subexpressions");
                    return -1;
                }
                *value = (rc > 0);
            }
            break;
        case expr_exists:
            {
                coda_cursor prev_cursor;
                coda_type_class type_class;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    if (coda_errno != CODA_ERROR_EXPRESSION)
                    {
                        /* could not access path */
                        coda_errno = 0;
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                    return -1;
                }
                if (coda_cursor_get_type_class(&info->cursor, &type_class) != 0)
                {
                    return -1;
                }
                if (type_class == coda_special_class)
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(&info->cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    if (special_type == coda_special_no_data)
                    {
                        *value = 0;
                        info->cursor = prev_cursor;
                        return 0;
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_all:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (!condition)
                        {
                            *value = 0;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 1;
                info->cursor = prev_cursor;
            }
            break;
        case expr_array_exists:
            {
                coda_cursor prev_cursor;
                long num_elements;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (coda_cursor_get_num_elements(&info->cursor, &num_elements) != 0)
                {
                    return -1;
                }
                if (num_elements > 0)
                {
                    long i;

                    if (coda_cursor_goto_first_array_element(&info->cursor) != 0)
                    {
                        return -1;
                    }
                    for (i = 0; i < num_elements; i++)
                    {
                        int condition;

                        if (eval_boolean(info, opexpr->operand[1], &condition) != 0)
                        {
                            return -1;
                        }
                        if (condition)
                        {
                            *value = 1;
                            return 0;
                        }
                        if (i < num_elements - 1)
                        {
                            if (coda_cursor_goto_next_array_element(&info->cursor) != 0)
                            {
                                return -1;
                            }
                        }
                    }
                }
                *value = 0;
                info->cursor = prev_cursor;
            }
            break;
        case expr_variable_exists:
            {
                long size;
                long i;

                assert(info->orig_cursor != NULL);
                if (info->variable_name != NULL)
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot perform search within search for product variables");
                    return -1;
                }

                if (coda_product_variable_get_size(info->orig_cursor->product, opexpr->identifier, &size) != 0)
                {
                    return -1;
                }
                info->variable_name = opexpr->identifier;
                for (i = 0; i < size; i++)
                {
                    int condition;

                    info->variable_index = i;
                    if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                    {
                        return -1;
                    }
                    if (condition)
                    {
                        *value = 1;
                        info->variable_name = NULL;
                        return 0;
                    }
                }
                *value = 0;
                info->variable_name = NULL;
            }
            break;
        case expr_if:
            {
                int condition;

                if (eval_boolean(info, opexpr->operand[0], &condition) != 0)
                {
                    return -1;
                }
                if (condition)
                {
                    if (eval_boolean(info, opexpr->operand[1], value) != 0)
                    {
                        return -1;
                    }
                }
                else
                {
                    if (eval_boolean(info, opexpr->operand[2], value) != 0)
                    {
                        return -1;
                    }
                }
            }
            break;
        case expr_at:
            {
                coda_cursor prev_cursor;

                assert(info->orig_cursor != NULL);
                prev_cursor = info->cursor;
                if (eval_cursor(info, opexpr->operand[0]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->cursor = prev_cursor;
            }
            break;
        case expr_with:
            {
                int64_t prev_index;
                int index_id = opexpr->identifier[0] - 'i';

                prev_index = info->index[index_id];
                if (eval_integer(info, opexpr->operand[0], &info->index[index_id]) != 0)
                {
                    return -1;
                }
                if (eval_boolean(info, opexpr->operand[1], value) != 0)
                {
                    return -1;
                }
                info->index[index_id] = prev_index;
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}